

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5ImagesArrayIndexing.cpp
# Opt level: O2

string * __thiscall
glcts::GPUShader5ImagesArrayIndexing::getComputeShaderCode
          (string *__return_storage_ptr__,GPUShader5ImagesArrayIndexing *this,string *param_1,
          string *param_2)

{
  ulong uVar1;
  string template_name;
  allocator<char> local_41;
  allocator<char> local_40 [8];
  string *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${GPU_SHADER5_REQUIRE}\n\nlayout (local_size_x = <-MAX-LOCAL-SIZE-X->,\n        local_size_y = <-MAX-LOCAL-SIZE-Y->,\n        local_size_z = 1) in;\n\nlayout (r32ui, binding = 0) uniform highp uimage2D image[4];\n\nvoid main(void)\n{\n   uvec4 texel0 = imageLoad(image[0], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n   uvec4 texel1 = imageLoad(image[1], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n   uvec4 texel2 = imageLoad(image[2], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n   uvec4 texel3 = imageLoad(image[3], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n   uvec4 addon  = uvec4(gl_LocalInvocationID.x+gl_LocalInvocationID.y);\n\n   imageStore(image[0], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel0  + addon);\n   imageStore(image[1], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel1  + addon);\n   imageStore(image[2], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel2  + addon);\n   imageStore(image[3], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel3  + addon);\n}\n"
             ,local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"<-MAX-LOCAL-SIZE-X->",&local_41);
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_40);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,local_38);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::assign((char *)local_40);
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_40);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,local_38);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShader5ImagesArrayIndexing::getComputeShaderCode(const std::string& local_size_x,
																const std::string& local_size_y)
{
	/* Compute shader template code */
	std::string m_compute_shader_template =
		"${VERSION}\n"
		"\n"
		"${GPU_SHADER5_REQUIRE}\n"
		"\n"
		"layout (local_size_x = <-MAX-LOCAL-SIZE-X->,\n"
		"        local_size_y = <-MAX-LOCAL-SIZE-Y->,\n"
		"        local_size_z = 1) in;\n"
		"\n"
		"layout (r32ui, binding = 0) uniform highp uimage2D image[4];\n"
		"\n"
		"void main(void)\n"
		"{\n"
		"   uvec4 texel0 = imageLoad(image[0], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n"
		"   uvec4 texel1 = imageLoad(image[1], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n"
		"   uvec4 texel2 = imageLoad(image[2], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n"
		"   uvec4 texel3 = imageLoad(image[3], ivec2(gl_LocalInvocationID.x, gl_LocalInvocationID.y) );\n"
		"   uvec4 addon  = uvec4(gl_LocalInvocationID.x+gl_LocalInvocationID.y);\n"
		"\n"
		"   imageStore(image[0], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel0  + addon);\n"
		"   imageStore(image[1], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel1  + addon);\n"
		"   imageStore(image[2], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel2  + addon);\n"
		"   imageStore(image[3], ivec2( gl_LocalInvocationID.x, gl_LocalInvocationID.y), texel3  + addon);\n"
		"}\n";

	/* Insert information on local size in X direction */
	std::string template_name	 = "<-MAX-LOCAL-SIZE-X->";
	std::size_t template_position = m_compute_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_compute_shader_template =
			m_compute_shader_template.replace(template_position, template_name.length(), local_size_x);

		template_position = m_compute_shader_template.find(template_name);
	}

	/* Insert information on local size in Y direction */
	template_name	 = "<-MAX-LOCAL-SIZE-Y->";
	template_position = m_compute_shader_template.find(template_name);

	while (template_position != std::string::npos)
	{
		m_compute_shader_template =
			m_compute_shader_template.replace(template_position, template_name.length(), local_size_y);

		template_position = m_compute_shader_template.find(template_name);
	}

	return m_compute_shader_template;
}